

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

uint8_t * __thiscall
edition_unittest::TestPackedTypes::_InternalSerialize
          (TestPackedTypes *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_280_1_493b367e_for_TestPackedTypes_3 *this_00;
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *this_01;
  RepeatedField<float> *this_02;
  RepeatedField<double> *this_03;
  RepeatedField<bool> *this_04;
  long *plVar2;
  int *piVar3;
  int iVar4;
  SooRep *pSVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long *plVar10;
  char *pcVar11;
  int *piVar12;
  uint8_t *puVar13;
  byte *extraout_RAX;
  byte *extraout_RAX_00;
  byte *extraout_RAX_01;
  byte *extraout_RAX_02;
  byte *extraout_RAX_03;
  byte *extraout_RAX_04;
  byte *extraout_RAX_05;
  byte *pbVar14;
  uint uVar15;
  ulong uVar16;
  LongSooRep *unaff_R12;
  LongSooRep *unaff_R13;
  byte *pbVar17;
  bool bVar18;
  
  uVar8 = *(uint *)((long)&this->field_0 + 0x10);
  if ((int)uVar8 < 1) {
LAB_00c5f54f:
    uVar7 = *(uint *)((long)&this->field_0 + 0x28);
    if ((int)uVar7 < 1) goto LAB_00c5f618;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_int64_;
      target[0] = 0xda;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_00c5ff3a;
      pbVar17 = target + 1;
      goto LAB_00c5f58a;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_00;
LAB_00c5ff77:
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar7 | 0x80;
      uVar8 = uVar7 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar7;
      uVar7 = uVar8;
    } while (bVar18);
LAB_00c5f653:
    *pbVar14 = (byte)uVar8;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)((long)&(this->field_0)._impl_.packed_uint32_.soo_rep_.field_0 + 8);
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
    }
    target = pbVar17 + 2;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
    unaff_R13 = (LongSooRep *)
                ((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + (long)iVar6 * 4);
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar8 = *(uint *)&((SooRep *)&unaff_R12->elements_int)->field_0;
      uVar7 = uVar8;
      if (0x7f < uVar8) {
        do {
          *target = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          target = target + 1;
          bVar18 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar18);
      }
      unaff_R12 = (LongSooRep *)((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + 4);
      *target = (byte)uVar8;
      target = target + 1;
    } while (unaff_R12 < unaff_R13);
LAB_00c5f6db:
    uVar7 = *(uint *)((long)&this->field_0 + 0x58);
    if ((int)uVar7 < 1) goto LAB_00c5f7a4;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_uint64_;
      target[0] = 0xea;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_00c5ffb4;
      pbVar17 = target + 1;
      goto LAB_00c5f716;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_02;
LAB_00c5fff1:
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar7 | 0x80;
      uVar8 = uVar7 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar7;
      uVar7 = uVar8;
    } while (bVar18);
LAB_00c5f7e2:
    *pbVar14 = (byte)uVar8;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)((long)&(this->field_0)._impl_.packed_sint32_.soo_rep_.field_0 + 8);
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
    }
    target = pbVar17 + 2;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
    pSVar5 = (SooRep *)&unaff_R12->elements_int;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      iVar4 = *(int *)&((SooRep *)&unaff_R12->elements_int)->field_0;
      uVar7 = iVar4 >> 0x1f ^ iVar4 * 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) {
        do {
          *target = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          target = target + 1;
          bVar18 = 0x3fff < uVar8;
          uVar8 = uVar7;
        } while (bVar18);
      }
      unaff_R12 = (LongSooRep *)((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + 4);
      *target = (byte)uVar7;
      target = target + 1;
    } while (unaff_R12 < (LongSooRep *)((long)&pSVar5->field_0 + (long)iVar6 * 4));
LAB_00c5f870:
    uVar7 = *(uint *)((long)&this->field_0 + 0x88);
    if ((int)uVar7 < 1) goto LAB_00c5f94b;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_sint64_;
      target[0] = 0xfa;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_00c6002e;
      pbVar17 = target + 1;
      goto LAB_00c5f8b1;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_04;
    uVar8 = uVar7;
LAB_00c6006d:
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar15 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar15;
    } while (bVar18);
LAB_00c5f9b5:
    target = pbVar17 + 2;
    *pbVar14 = (byte)uVar15;
    if ((unaff_R12->elements_int & 4) == 0) {
      pcVar11 = (char *)((long)&this->field_0 + 0x98);
    }
    else {
      pcVar11 = google::protobuf::internal::LongSooRep::elements(unaff_R12);
    }
    if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_00c600ed;
    memcpy(target,pcVar11,(ulong)uVar7);
    target = target + (int)uVar7;
  }
  else {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      this_00 = &this->field_0;
      target[0] = 0xd2;
      target[1] = '\x05';
      pbVar14 = target + 2;
      uVar7 = uVar8;
      if (uVar8 < 0x80) {
        pbVar17 = target + 1;
      }
      else {
        do {
          pbVar17 = pbVar14;
          *pbVar17 = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          pbVar14 = pbVar17 + 1;
          bVar18 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar18);
      }
      *pbVar14 = (byte)uVar8;
      if ((undefined1  [280])((undefined1  [280])*this_00 & (undefined1  [280])0x4) ==
          (undefined1  [280])0x0) {
        unaff_R12 = (LongSooRep *)((long)&(this->field_0)._impl_.packed_int32_.soo_rep_.field_0 + 8)
        ;
      }
      else {
        unaff_R12 = (LongSooRep *)
                    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_)
        ;
      }
      target = pbVar17 + 2;
      iVar6 = google::protobuf::internal::SooRep::size
                        ((SooRep *)&this_00->_impl_,
                         (undefined1  [280])((undefined1  [280])*this_00 & (undefined1  [280])0x4)
                         == (undefined1  [280])0x0);
      unaff_R13 = (LongSooRep *)
                  ((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + (long)iVar6 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar16 = (ulong)*(int *)&((SooRep *)&unaff_R12->elements_int)->field_0;
        uVar9 = uVar16;
        if (0x7f < uVar16) {
          do {
            *target = (byte)uVar9 | 0x80;
            uVar16 = uVar9 >> 7;
            target = target + 1;
            bVar18 = 0x3fff < uVar9;
            uVar9 = uVar16;
          } while (bVar18);
        }
        unaff_R12 = (LongSooRep *)((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + 4);
        *target = (byte)uVar16;
        target = target + 1;
      } while (unaff_R12 < unaff_R13);
      goto LAB_00c5f54f;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX;
LAB_00c5ff3a:
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar18);
LAB_00c5f58a:
    *pbVar14 = (byte)uVar7;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)
                  &(this->field_0)._impl_.packed_int64_.soo_rep_.field_0.short_rep.field_1;
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
    }
    target = pbVar17 + 2;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
    unaff_R13 = (LongSooRep *)((long)unaff_R12 + (long)iVar6 * 8);
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar9 = unaff_R12->elements_int;
      uVar16 = uVar9;
      if (0x7f < uVar9) {
        do {
          *target = (byte)uVar16 | 0x80;
          uVar9 = uVar16 >> 7;
          target = target + 1;
          bVar18 = 0x3fff < uVar16;
          uVar16 = uVar9;
        } while (bVar18);
      }
      unaff_R12 = (LongSooRep *)((long)unaff_R12 + 8);
      *target = (byte)uVar9;
      target = target + 1;
    } while (unaff_R12 < unaff_R13);
LAB_00c5f618:
    uVar8 = *(uint *)((long)&this->field_0 + 0x40);
    if ((int)uVar8 < 1) goto LAB_00c5f6db;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_uint32_;
      target[0] = 0xe2;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar7 = uVar8;
      if (0x7f < uVar8) goto LAB_00c5ff77;
      pbVar17 = target + 1;
      goto LAB_00c5f653;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_01;
LAB_00c5ffb4:
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar18);
LAB_00c5f716:
    *pbVar14 = (byte)uVar7;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)
                  &(this->field_0)._impl_.packed_uint64_.soo_rep_.field_0.short_rep.field_1;
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
    }
    target = pbVar17 + 2;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
    unaff_R13 = (LongSooRep *)((long)unaff_R12 + (long)iVar6 * 8);
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar9 = unaff_R12->elements_int;
      uVar16 = uVar9;
      if (0x7f < uVar9) {
        do {
          *target = (byte)uVar16 | 0x80;
          uVar9 = uVar16 >> 7;
          target = target + 1;
          bVar18 = 0x3fff < uVar16;
          uVar16 = uVar9;
        } while (bVar18);
      }
      unaff_R12 = (LongSooRep *)((long)unaff_R12 + 8);
      *target = (byte)uVar9;
      target = target + 1;
    } while (unaff_R12 < unaff_R13);
LAB_00c5f7a4:
    uVar8 = *(uint *)((long)&this->field_0 + 0x70);
    if ((int)uVar8 < 1) goto LAB_00c5f870;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (target < stream->end_) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_sint32_;
      target[0] = 0xf2;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar7 = uVar8;
      if (0x7f < uVar8) goto LAB_00c5fff1;
      pbVar17 = target + 1;
      goto LAB_00c5f7e2;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_03;
LAB_00c6002e:
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar18);
LAB_00c5f8b1:
    *pbVar14 = (byte)uVar7;
    if ((unaff_R13->elements_int & 4) == 0) {
      plVar10 = (long *)((long)&this->field_0 + 0x80);
    }
    else {
      plVar10 = (long *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
    }
    target = pbVar17 + 2;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R13,(unaff_R13->elements_int & 4) == 0);
    plVar2 = plVar10 + iVar6;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar16 = *plVar10 >> 0x3f ^ *plVar10 * 2;
      uVar9 = uVar16;
      if (0x7f < uVar16) {
        do {
          *target = (byte)uVar9 | 0x80;
          uVar16 = uVar9 >> 7;
          target = target + 1;
          bVar18 = 0x3fff < uVar9;
          uVar9 = uVar16;
        } while (bVar18);
      }
      plVar10 = plVar10 + 1;
      *target = (byte)uVar16;
      target = target + 1;
    } while (plVar10 < plVar2);
LAB_00c5f94b:
    unaff_R12 = (LongSooRep *)&(this->field_0)._impl_.packed_fixed32_;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R12,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
    if (0 < iVar6) {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      iVar6 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R12,
                         (undefined1  [16])
                         ((undefined1  [16])
                          (((RepeatedField<unsigned_int> *)unaff_R12)->soo_rep_).field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
      if (stream->end_ <= target) {
        _InternalSerialize();
        pbVar14 = extraout_RAX_05;
        uVar8 = uVar7;
LAB_00c600ae:
        do {
          pbVar17 = pbVar14;
          *pbVar17 = (byte)uVar8 | 0x80;
          uVar15 = uVar8 >> 7;
          pbVar14 = pbVar17 + 1;
          bVar18 = 0x3fff < uVar8;
          uVar8 = uVar15;
        } while (bVar18);
LAB_00c5fa5f:
        target = pbVar17 + 2;
        *pbVar14 = (byte)uVar15;
        if ((unaff_R12->elements_int & 4) == 0) {
          pcVar11 = (char *)((long)&this->field_0 + 0xa8);
        }
        else {
          pcVar11 = google::protobuf::internal::LongSooRep::elements(unaff_R12);
        }
        if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_00c60143;
        memcpy(target,pcVar11,(ulong)uVar7);
        target = target + (int)uVar7;
        goto LAB_00c5fa9f;
      }
      uVar7 = iVar6 << 2;
      target[0] = 0x82;
      target[1] = 6;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_00c6006d;
      pbVar17 = target + 1;
      uVar15 = uVar7;
      goto LAB_00c5f9b5;
    }
  }
  while( true ) {
    unaff_R12 = (LongSooRep *)&(this->field_0)._impl_.packed_fixed64_;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R12,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
    if (iVar6 < 1) break;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar18 = (undefined1  [16])
             ((undefined1  [16])(((RepeatedField<unsigned_long> *)unaff_R12)->soo_rep_).field_0 &
             (undefined1  [16])0x4) == (undefined1  [16])0x0;
    pcVar11 = (char *)(ulong)bVar18;
    iVar6 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R12,bVar18);
    if (target < stream->end_) {
      uVar7 = iVar6 << 3;
      target[0] = 0x8a;
      target[1] = 6;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_00c600ae;
      pbVar17 = target + 1;
      uVar15 = uVar7;
      goto LAB_00c5fa5f;
    }
    _InternalSerialize();
LAB_00c600ed:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar11,uVar7,target);
  }
LAB_00c5fa9f:
  while( true ) {
    pRVar1 = &(this->field_0)._impl_.packed_sfixed32_;
    iVar6 = google::protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
    if (iVar6 < 1) goto LAB_00c5fb49;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar18 = (undefined1  [16])
             ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
             (undefined1  [16])0x0;
    pcVar11 = (char *)(ulong)bVar18;
    iVar6 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar18);
    if (target < stream->end_) break;
    _InternalSerialize();
LAB_00c60143:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar11,uVar7,target);
  }
  uVar7 = iVar6 << 2;
  target[0] = 0x92;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar17 = target + 1;
    uVar15 = uVar7;
  }
  else {
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar15 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar15;
    } while (bVar18);
  }
  target = pbVar17 + 2;
  *pbVar14 = (byte)uVar15;
  if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar11 = (char *)((long)&this->field_0 + 0xb8);
  }
  else {
    pcVar11 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_00c60199;
  memcpy(target,pcVar11,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_00c5fb49:
  this_01 = &(this->field_0)._impl_.packed_sfixed64_;
  iVar6 = google::protobuf::internal::SooRep::size
                    (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  if (iVar6 < 1) goto LAB_00c5fbf3;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar18 = (undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar11 = (char *)(ulong)bVar18;
  iVar6 = google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar18);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_00c60199:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar11,uVar7,target);
    goto LAB_00c5fb49;
  }
  uVar7 = iVar6 << 3;
  target[0] = 0x9a;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar17 = target + 1;
    uVar15 = uVar7;
  }
  else {
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar15 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar15;
    } while (bVar18);
  }
  target = pbVar17 + 2;
  *pbVar14 = (byte)uVar15;
  if ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar11 = (char *)((long)&this->field_0 + 200);
  }
  else {
    pcVar11 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_00c601ef;
  memcpy(target,pcVar11,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_00c5fbf3:
  this_02 = &(this->field_0)._impl_.packed_float_;
  iVar6 = google::protobuf::internal::SooRep::size
                    (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  if (iVar6 < 1) goto LAB_00c5fc9d;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar18 = (undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar11 = (char *)(ulong)bVar18;
  iVar6 = google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar18);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_00c601ef:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar11,uVar7,target);
    goto LAB_00c5fbf3;
  }
  uVar7 = iVar6 << 2;
  target[0] = 0xa2;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar17 = target + 1;
    uVar15 = uVar7;
  }
  else {
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar15 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar15;
    } while (bVar18);
  }
  target = pbVar17 + 2;
  *pbVar14 = (byte)uVar15;
  if ((undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar11 = (char *)((long)&this->field_0 + 0xd8);
  }
  else {
    pcVar11 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_00c60245;
  memcpy(target,pcVar11,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_00c5fc9d:
  this_03 = &(this->field_0)._impl_.packed_double_;
  iVar6 = google::protobuf::internal::SooRep::size
                    (&this_03->soo_rep_,(*(byte *)((long)&this->field_0 + 0xe0) & 4) == 0);
  if (iVar6 < 1) goto LAB_00c5fd47;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar18 = (undefined1  [16])((undefined1  [16])(this_03->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar11 = (char *)(ulong)bVar18;
  iVar6 = google::protobuf::internal::SooRep::size(&this_03->soo_rep_,bVar18);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_00c60245:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar11,uVar7,target);
    goto LAB_00c5fc9d;
  }
  uVar7 = iVar6 << 3;
  target[0] = 0xaa;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar17 = target + 1;
    uVar15 = uVar7;
  }
  else {
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar8 | 0x80;
      uVar15 = uVar8 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar8;
      uVar8 = uVar15;
    } while (bVar18);
  }
  target = pbVar17 + 2;
  *pbVar14 = (byte)uVar15;
  if ((undefined1  [16])((undefined1  [16])(this_03->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar11 = (char *)((long)&this->field_0 + 0xe8);
  }
  else {
    pcVar11 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_03);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_00c6029b;
  memcpy(target,pcVar11,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_00c5fd47:
  this_04 = &(this->field_0)._impl_.packed_bool_;
  bVar18 = (*(byte *)((long)&this->field_0 + 0xf0) & 4) == 0;
  pbVar14 = (byte *)(ulong)bVar18;
  iVar6 = google::protobuf::internal::SooRep::size(&this_04->soo_rep_,bVar18);
  if (iVar6 < 1) goto LAB_00c5fdee;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar18 = (undefined1  [16])((undefined1  [16])(this_04->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar11 = (char *)(ulong)bVar18;
  uVar8 = google::protobuf::internal::SooRep::size(&this_04->soo_rep_,bVar18);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_00c6029b:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar11,uVar7,target);
    goto LAB_00c5fd47;
  }
  target[0] = 0xb2;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar7 = uVar8;
  if (uVar8 < 0x80) {
    pbVar17 = target + 1;
    uVar15 = uVar8;
  }
  else {
    do {
      pbVar17 = pbVar14;
      *pbVar17 = (byte)uVar7 | 0x80;
      uVar15 = uVar7 >> 7;
      pbVar14 = pbVar17 + 1;
      bVar18 = 0x3fff < uVar7;
      uVar7 = uVar15;
    } while (bVar18);
  }
  pbVar17 = pbVar17 + 2;
  *pbVar14 = (byte)uVar15;
  if ((undefined1  [16])((undefined1  [16])(this_04->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pbVar14 = (byte *)((long)&this->field_0 + 0xf8);
  }
  else {
    pbVar14 = (byte *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_04);
  }
  if ((long)stream->end_ - (long)pbVar17 < (long)(int)uVar8) goto LAB_00c602ed;
  memcpy(pbVar17,pbVar14,(ulong)uVar8);
  target = pbVar17 + (int)uVar8;
LAB_00c5fdee:
  do {
    uVar8 = *(uint *)((long)&this->field_0 + 0x110);
    if (uVar8 == 0) goto LAB_00c5fec0;
    pbVar17 = target;
    if (stream->end_ <= target) {
      pbVar17 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar14 = target;
    }
    if (pbVar17 < stream->end_) {
      pRVar1 = &(this->field_0)._impl_.packed_enum_;
      pbVar17[0] = 0xba;
      pbVar17[1] = 6;
      pbVar14 = pbVar17 + 2;
      uVar7 = uVar8;
      if (uVar8 < 0x80) {
        pbVar17 = pbVar17 + 1;
      }
      else {
        do {
          pbVar17 = pbVar14;
          *pbVar17 = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          pbVar14 = pbVar17 + 1;
          bVar18 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar18);
      }
      *pbVar14 = (byte)uVar8;
      if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        piVar12 = (int *)((long)&this->field_0 + 0x108);
      }
      else {
        piVar12 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
      }
      target = pbVar17 + 2;
      iVar6 = google::protobuf::internal::SooRep::size
                        (&pRVar1->soo_rep_,
                         (undefined1  [16])
                         ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                         (undefined1  [16])0x0);
      piVar3 = piVar12 + iVar6;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar16 = (ulong)*piVar12;
        uVar9 = uVar16;
        if (0x7f < uVar16) {
          do {
            *target = (byte)uVar9 | 0x80;
            uVar16 = uVar9 >> 7;
            target = target + 1;
            bVar18 = 0x3fff < uVar9;
            uVar9 = uVar16;
          } while (bVar18);
        }
        piVar12 = piVar12 + 1;
        *target = (byte)uVar16;
        target = target + 1;
      } while (piVar12 < piVar3);
LAB_00c5fec0:
      uVar9 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar9 & 1) != 0) {
        puVar13 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                            ((UnknownFieldSet *)((uVar9 & 0xfffffffffffffffe) + 8),target,stream);
        return puVar13;
      }
      return target;
    }
    _InternalSerialize();
LAB_00c602ed:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pbVar14,uVar8,pbVar17);
  } while( true );
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestPackedTypes::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestPackedTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestPackedTypes)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 packed_int32 = 90 [features = {
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          90, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // repeated int64 packed_int64 = 91 [features = {
  {
    int byte_size = this_._impl_._packed_int64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          91, this_._internal_packed_int64(), byte_size, target);
    }
  }

  // repeated uint32 packed_uint32 = 92 [features = {
  {
    int byte_size = this_._impl_._packed_uint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt32Packed(
          92, this_._internal_packed_uint32(), byte_size, target);
    }
  }

  // repeated uint64 packed_uint64 = 93 [features = {
  {
    int byte_size = this_._impl_._packed_uint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          93, this_._internal_packed_uint64(), byte_size, target);
    }
  }

  // repeated sint32 packed_sint32 = 94 [features = {
  {
    int byte_size = this_._impl_._packed_sint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt32Packed(
          94, this_._internal_packed_sint32(), byte_size, target);
    }
  }

  // repeated sint64 packed_sint64 = 95 [features = {
  {
    int byte_size = this_._impl_._packed_sint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt64Packed(
          95, this_._internal_packed_sint64(), byte_size, target);
    }
  }

  // repeated fixed32 packed_fixed32 = 96 [features = {
  if (this_._internal_packed_fixed32_size() > 0) {
    target = stream->WriteFixedPacked(96, this_._internal_packed_fixed32(), target);
  }

  // repeated fixed64 packed_fixed64 = 97 [features = {
  if (this_._internal_packed_fixed64_size() > 0) {
    target = stream->WriteFixedPacked(97, this_._internal_packed_fixed64(), target);
  }

  // repeated sfixed32 packed_sfixed32 = 98 [features = {
  if (this_._internal_packed_sfixed32_size() > 0) {
    target = stream->WriteFixedPacked(98, this_._internal_packed_sfixed32(), target);
  }

  // repeated sfixed64 packed_sfixed64 = 99 [features = {
  if (this_._internal_packed_sfixed64_size() > 0) {
    target = stream->WriteFixedPacked(99, this_._internal_packed_sfixed64(), target);
  }

  // repeated float packed_float = 100 [features = {
  if (this_._internal_packed_float_size() > 0) {
    target = stream->WriteFixedPacked(100, this_._internal_packed_float(), target);
  }

  // repeated double packed_double = 101 [features = {
  if (this_._internal_packed_double_size() > 0) {
    target = stream->WriteFixedPacked(101, this_._internal_packed_double(), target);
  }

  // repeated bool packed_bool = 102 [features = {
  if (this_._internal_packed_bool_size() > 0) {
    target = stream->WriteFixedPacked(102, this_._internal_packed_bool(), target);
  }

  // repeated .edition_unittest.ForeignEnum packed_enum = 103 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_enum_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          103, this_._internal_packed_enum(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestPackedTypes)
  return target;
}